

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O2

void interfaces_tests::hasBlocks_invoker(void)

{
  long lVar1;
  unit_test_log_t *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  pointer local_710;
  pointer local_708;
  char *local_700;
  char *local_6f8;
  pointer local_6f0;
  pointer local_6e8;
  char *local_6e0;
  char *local_6d8;
  pointer local_6d0;
  pointer local_6c8;
  char *local_6c0;
  char *local_6b8;
  pointer local_6b0;
  pointer local_6a8;
  char *local_6a0;
  char *local_698;
  pointer local_690;
  pointer local_688;
  char *local_680;
  char *local_678;
  basic_wrap_stringstream<char> local_670;
  hasBlocks t;
  
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_678 = "";
  memset((basic_wrap_stringstream<char> *)&t,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream((basic_wrap_stringstream<char> *)&t)
  ;
  std::operator<<((ostream *)&t,'\"');
  std::operator<<((ostream *)&t,"hasBlocks");
  std::operator<<((ostream *)&t,"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_((basic_wrap_stringstream<char> *)&t)
  ;
  local_690 = (pbVar3->_M_dataplus)._M_p;
  local_688 = local_690 + pbVar3->_M_string_length;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x80;
  file.m_begin = (iterator)&local_680;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file,(size_t)&local_690,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream
            ((basic_wrap_stringstream<char> *)&t);
  hasBlocks::hasBlocks(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_698 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"hasBlocks");
  std::operator<<((ostream *)&local_670,"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_6b0 = (pbVar3->_M_dataplus)._M_p;
  local_6a8 = local_6b0 + pbVar3->_M_string_length;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  file_00.m_end = (iterator)0x80;
  file_00.m_begin = (iterator)&local_6a0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_00,(size_t)&local_6b0,msg_00);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_6b8 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"hasBlocks");
  std::operator<<((ostream *)&local_670,"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_6d0 = (pbVar3->_M_dataplus)._M_p;
  local_6c8 = local_6d0 + pbVar3->_M_string_length;
  msg_01.m_end = in_R9;
  msg_01.m_begin = in_R8;
  file_01.m_end = (iterator)0x80;
  file_01.m_begin = (iterator)&local_6c0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_01,(size_t)&local_6d0,msg_01);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  hasBlocks::test_method(&t);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_6d8 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"hasBlocks");
  std::operator<<((ostream *)&local_670,"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_6f0 = (pbVar3->_M_dataplus)._M_p;
  local_6e8 = local_6f0 + pbVar3->_M_string_length;
  msg_02.m_end = in_R9;
  msg_02.m_begin = in_R8;
  file_02.m_end = (iterator)0x80;
  file_02.m_begin = (iterator)&local_6e0;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_02,(size_t)&local_6f0,msg_02);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
  ;
  local_6f8 = "";
  memset(&local_670,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_670);
  std::operator<<((ostream *)&local_670,'\"');
  std::operator<<((ostream *)&local_670,"hasBlocks");
  std::operator<<((ostream *)&local_670,"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(&local_670);
  local_710 = (pbVar3->_M_dataplus)._M_p;
  local_708 = local_710 + pbVar3->_M_string_length;
  msg_03.m_end = in_R9;
  msg_03.m_begin = in_R8;
  file_03.m_end = (iterator)0x80;
  file_03.m_begin = (iterator)&local_700;
  boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,file_03,(size_t)&local_710,msg_03);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_670);
  TestChain100Setup::~TestChain100Setup(&t.super_BOOST_AUTO_TEST_CASE_FIXTURE);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(hasBlocks)
{
    LOCK(::cs_main);
    auto& chain = m_node.chain;
    const CChain& active = Assert(m_node.chainman)->ActiveChain();

    // Test ranges
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 10, 90));
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 10, {}));
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 0, 90));
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 0, {}));
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), -1000, 1000));
    active[5]->nStatus &= ~BLOCK_HAVE_DATA;
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 10, 90));
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 10, {}));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 0, 90));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 0, {}));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), -1000, 1000));
    active[95]->nStatus &= ~BLOCK_HAVE_DATA;
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 10, 90));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 10, {}));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 0, 90));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 0, {}));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), -1000, 1000));
    active[50]->nStatus &= ~BLOCK_HAVE_DATA;
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 10, 90));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 10, {}));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 0, 90));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 0, {}));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), -1000, 1000));

    // Test edge cases
    BOOST_CHECK(chain->hasBlocks(active.Tip()->GetBlockHash(), 6, 49));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 5, 49));
    BOOST_CHECK(!chain->hasBlocks(active.Tip()->GetBlockHash(), 6, 50));
}